

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool flatbuffers::operator==(Array<int,_(unsigned_short)2> *lhs,Array<int,_(unsigned_short)2> *rhs)

{
  uint16_t uVar1;
  uint16_t uVar2;
  int iVar3;
  uint8_t *__s1;
  uint8_t *__s2;
  undefined1 local_25;
  undefined1 local_19;
  Array<int,_(unsigned_short)2> *rhs_local;
  Array<int,_(unsigned_short)2> *lhs_local;
  
  local_19 = true;
  if (lhs != rhs) {
    uVar1 = Array<int,_(unsigned_short)2>::size(lhs);
    uVar2 = Array<int,_(unsigned_short)2>::size(rhs);
    local_25 = false;
    if (uVar1 == uVar2) {
      __s1 = Array<int,_(unsigned_short)2>::Data(lhs);
      __s2 = Array<int,_(unsigned_short)2>::Data(rhs);
      uVar1 = Array<int,_(unsigned_short)2>::size(rhs);
      iVar3 = memcmp(__s1,__s2,(ulong)uVar1 << 2);
      local_25 = iVar3 == 0;
    }
    local_19 = local_25;
  }
  return local_19;
}

Assistant:

bool operator==(const Array<T, length> &lhs,
                const Array<T, length> &rhs) noexcept {
  return std::addressof(lhs) == std::addressof(rhs) ||
         (lhs.size() == rhs.size() &&
          std::memcmp(lhs.Data(), rhs.Data(), rhs.size() * sizeof(T)) == 0);
}